

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

__pid_t __thiscall anon_unknown.dwarf_132c2::VSync::wait(VSync *this,void *__stat_loc)

{
  uint64_t uVar1;
  ulong uVar2;
  VSync *this_00;
  long lVar3;
  unsigned_long *__rep;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  int ch;
  uint64_t tNextCur_us;
  uint64_t tStep_us;
  uint64_t tNow_us;
  duration<long,_std::ratio<1L,_1000000L>_> *local_58;
  ulong local_48;
  VSync *in_stack_ffffffffffffffc0;
  duration<long,std::ratio<1l,1000000l>> local_38 [12];
  int local_2c;
  long local_28;
  VSync *local_18;
  
  local_18 = (VSync *)t_us(in_stack_ffffffffffffffc0);
  if (((ulong)__stat_loc & 1) == 0) {
    local_58 = (duration<long,_std::ratio<1L,_1000000L>_> *)this->tStepIdle_us;
  }
  else {
    local_58 = (duration<long,_std::ratio<1L,_1000000L>_> *)this->tStepActive_us;
  }
  local_28 = (long)&local_58->__r + this->tNext_us;
  do {
    if ((VSync *)(local_28 - 100U) <= local_18) {
      this->tNext_us = (long)&local_58->__r + this->tNext_us;
      local_18 = this;
LAB_001450cc:
      return (__pid_t)local_18;
    }
    uVar10 = (undefined4)DAT_001e49c0;
    uVar11 = DAT_001e49c0._4_4_;
    auVar5._8_4_ = (int)((ulong)local_18 >> 0x20);
    auVar5._0_8_ = local_18;
    auVar5._12_4_ = uVar11;
    uVar1 = this->tStepActive_us;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = uVar11;
    auVar6._8_4_ = (int)((ulong)local_28 >> 0x20);
    auVar6._0_8_ = local_28;
    auVar6._12_4_ = uVar11;
    if (((auVar9._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(uVar10,(int)uVar1) - 4503599627370496.0)) * 0.5 +
        (auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(uVar10,(int)local_18) - 4503599627370496.0) <
        (auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(uVar10,(int)local_28) - 4503599627370496.0)) {
      local_2c = wgetch(_stdscr);
      if (local_2c != -1) {
        ungetch(local_2c);
        goto LAB_001450cc;
      }
      local_2c = 0xffffffff;
    }
    uVar1 = this->tStepActive_us;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar4 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.9;
    uVar2 = (ulong)dVar4;
    this_00 = (VSync *)(uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
    lVar3 = local_28 - (long)local_18;
    auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar8._0_8_ = lVar3;
    auVar8._12_4_ = 0x45300000;
    dVar4 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 0.9;
    local_48 = (ulong)dVar4;
    local_48 = local_48 | (long)(dVar4 - 9.223372036854776e+18) & (long)local_48 >> 0x3f;
    __rep = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffc0,&local_48);
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
              (local_38,__rep);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(local_58);
    local_18 = (VSync *)t_us(this_00);
  } while( true );
}

Assistant:

inline void wait(bool active) {
            uint64_t tNow_us = t_us();

            auto tStep_us = active ? tStepActive_us : tStepIdle_us;
            auto tNextCur_us = tNext_us + tStep_us;

            while (tNow_us < tNextCur_us - 100) {
                if (tNow_us + 0.5*tStepActive_us < tNextCur_us) {
                    int ch = wgetch(stdscr);

                    if (ch != ERR) {
                        ungetch(ch);
                        tNextCur_us = tNow_us;

                        return;
                    }
                }

                std::this_thread::sleep_for(std::chrono::microseconds(
                        std::min((uint64_t)(0.9*tStepActive_us),
                                 (uint64_t) (0.9*(tNextCur_us - tNow_us))
                                 )));

                tNow_us = t_us();
            }

            tNext_us += tStep_us;
        }